

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
int_writer<wchar_t,fmt::v6::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  undefined2 uVar1;
  int iVar2;
  wchar_t *__dest;
  bool bVar3;
  undefined1 *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined1 uVar10;
  undefined1 auVar9 [16];
  undefined1 auStack_68 [80];
  
  uVar6 = *(uint *)this;
  iVar2 = *(int *)(this + 4);
  lVar8 = (long)iVar2;
  puVar4 = auStack_68 + lVar8 * 4;
  uVar7 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar7 / 100;
      uVar1 = *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar7 % 100) * 2);
      uVar10 = (undefined1)((ushort)uVar1 >> 8);
      auVar9 = ZEXT416(CONCAT22((short)(CONCAT13(uVar10,CONCAT12(uVar10,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar9 = pshuflw(auVar9,auVar9,0x60);
      *(ulong *)(puVar4 + -8) = CONCAT44(auVar9._4_4_ >> 0x18,auVar9._0_4_ >> 0x18);
      puVar4 = puVar4 + -8;
      bVar3 = 9999 < uVar7;
      uVar7 = uVar7 / 100;
    } while (bVar3);
  }
  __dest = *it;
  if (uVar6 < 10) {
    uVar6 = uVar6 | 0x30;
    lVar5 = -4;
  }
  else {
    *(int *)(puVar4 + -4) = (int)(char)basic_data<void>::digits[((ulong)uVar6 * 2 & 0xffffffff) + 1]
    ;
    uVar6 = (uint)(char)basic_data<void>::digits[(ulong)uVar6 * 2];
    lVar5 = -8;
  }
  *(uint *)(puVar4 + lVar5) = uVar6;
  if (iVar2 != 0) {
    memcpy(__dest,auStack_68,lVar8 * 4);
  }
  *it = __dest + lVar8;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }